

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

int Prs_CreateBlifNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  Cba_Man_t *p_00;
  int iVar1;
  Cba_ObjType_t CVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pName;
  Cba_Ntk_t *pCVar6;
  bool bVar7;
  Cba_Ntk_t *pBox_1;
  Cba_Ntk_t *pBox;
  int FuncId;
  int ActId;
  int FormId;
  int iFon;
  int iTerm;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vBox;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  Cba_NtkCleanMap(p);
  for (iObj = 0; iVar1 = Cba_NtkPiNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkPi(p,iObj);
    iVar5 = Cba_ObjName(p,iVar1);
    iVar1 = Cba_ObjFon0(p,iVar1);
    Cba_NtkSetMap(p,iVar5,iVar1);
  }
  iObj = 0;
  while( true ) {
    iVar1 = Prs_NtkBoxNum(pNtk);
    bVar7 = false;
    if (iObj < iVar1) {
      _k = Prs_BoxSignals(pNtk,iObj);
      bVar7 = _k != (Vec_Int_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Prs_BoxNtk(pNtk,iObj);
    iVar5 = Prs_BoxIONum(pNtk,iObj);
    if (iVar5 < 1) {
      __assert_fail("Prs_BoxIONum(pNtk, i) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                    ,0x1f6,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
    }
    iVar5 = Vec_IntSize(_k);
    if (iVar5 % 2 != 0) {
      __assert_fail("Vec_IntSize(vBox) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                    ,0x1f7,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
    }
    if (iVar1 == -1) {
      iVar1 = Cba_ObjAlloc(p,CBA_BOX_DFFRS,4,1);
      iVar5 = Vec_IntEntry(_k,3);
      iVar3 = Cba_ObjFon0(p,iVar1);
      Cba_NtkSetMap(p,iVar5,iVar3);
      iVar5 = Prs_BoxName(pNtk,iObj);
      Cba_ObjSetFunc(p,iVar1,iVar5 + 1);
    }
    else {
      iVar5 = Prs_BoxIsNode(pNtk,iObj);
      if (iVar5 == 0) {
        p_00 = p->pDesign;
        pName = Prs_NtkStr(pNtk,iVar1);
        pCVar6 = Cba_ManNtkFind(p_00,pName);
        iVar1 = Cba_NtkPiNum(pCVar6);
        iVar5 = Cba_NtkPoNum(pCVar6);
        iVar1 = Cba_ObjAlloc(p,CBA_OBJ_BOX,iVar1,iVar5);
        iVar5 = Cba_NtkId(pCVar6);
        Cba_ObjSetFunc(p,iVar1,iVar5);
        Cba_NtkCleanMap2(p);
        for (iTerm = 0; iVar5 = Cba_NtkPoNum(pCVar6), iTerm < iVar5; iTerm = iTerm + 1) {
          iVar5 = Cba_NtkPo(pCVar6,iTerm);
          iVar5 = Cba_ObjName(pCVar6,iVar5);
          Cba_NtkSetMap2(p,iVar5,iTerm + 1);
        }
        for (iTerm = 0; iVar5 = Vec_IntSize(_k), iTerm + 1 < iVar5; iTerm = iTerm + 2) {
          iVar5 = Vec_IntEntry(_k,iTerm);
          iVar3 = Vec_IntEntry(_k,iTerm + 1);
          iVar4 = Cba_NtkGetMap2(p,iVar5);
          if (iVar4 != 0) {
            iVar5 = Cba_NtkGetMap2(p,iVar5);
            iVar5 = Cba_ObjFon(p,iVar1,iVar5 + -1);
            Cba_FonSetName(p,iVar5,iVar3);
            Cba_NtkSetMap(p,iVar3,iVar5);
          }
        }
      }
      else {
        iVar5 = Prs_BoxIONum(pNtk,iObj);
        iVar5 = Cba_ObjAlloc(p,CBA_BOX_NODE,iVar5 + -1,1);
        iVar3 = Cba_ObjFon0(p,iVar5);
        iVar4 = Vec_IntEntryLast(_k);
        Cba_FonSetName(p,iVar3,iVar4);
        iVar3 = Vec_IntEntryLast(_k);
        iVar4 = Cba_ObjFon0(p,iVar5);
        Cba_NtkSetMap(p,iVar3,iVar4);
        Cba_ObjSetFunc(p,iVar5,iVar1);
      }
    }
    iObj = iObj + 1;
  }
  iObj = 0;
  do {
    iVar1 = Prs_NtkBoxNum(pNtk);
    bVar7 = false;
    if (iObj < iVar1) {
      _k = Prs_BoxSignals(pNtk,iObj);
      bVar7 = _k != (Vec_Int_t *)0x0;
    }
    if (!bVar7) {
      for (iObj = 0; iVar1 = Cba_NtkPoNum(p), iObj < iVar1; iObj = iObj + 1) {
        iVar1 = Cba_NtkPo(p,iObj);
        iVar5 = Cba_ObjName(p,iVar1);
        iVar5 = Prs_CreateBlifFindFon(p,iVar5);
        if (iVar5 != 0) {
          Cba_ObjSetFinFon(p,iVar1,0,iVar5);
        }
      }
      return 0;
    }
    iVar1 = Cba_NtkPiNum(p);
    iVar5 = Cba_NtkPoNum(p);
    iVar1 = iVar1 + iVar5 + iObj + 1;
    iVar5 = Prs_BoxNtk(pNtk,iObj);
    if (iVar5 == -1) {
      CVar2 = Cba_ObjType(p,iVar1);
      if (CVar2 != CBA_BOX_DFFRS) {
        __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_DFFRS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                      ,0x21e,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      iVar5 = Vec_IntEntry(_k,1);
      iVar5 = Prs_CreateBlifFindFon(p,iVar5);
      if (iVar5 != 0) {
        Cba_ObjSetFinFon(p,iVar1,0,iVar5);
      }
    }
    else {
      iVar5 = Prs_BoxIsNode(pNtk,iObj);
      if (iVar5 == 0) {
        pCVar6 = Cba_ObjNtk(p,iVar1);
        iVar5 = Cba_NtkPiNum(pCVar6);
        iVar3 = Cba_ObjFinNum(p,iVar1);
        if (iVar5 != iVar3) {
          __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                        ,0x233,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        iVar5 = Cba_NtkPoNum(pCVar6);
        iVar3 = Cba_ObjFonNum(p,iVar1);
        if (iVar5 != iVar3) {
          __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                        ,0x234,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        Cba_NtkCleanMap2(p);
        for (iTerm = 0; iVar5 = Cba_NtkPiNum(pCVar6), iTerm < iVar5; iTerm = iTerm + 1) {
          iVar5 = Cba_NtkPi(pCVar6,iTerm);
          iVar5 = Cba_ObjName(pCVar6,iVar5);
          Cba_NtkSetMap2(p,iVar5,iTerm + 1);
        }
        for (iTerm = 0; iVar5 = Vec_IntSize(_k), iTerm + 1 < iVar5; iTerm = iTerm + 2) {
          iVar5 = Vec_IntEntry(_k,iTerm);
          iVar3 = Vec_IntEntry(_k,iTerm + 1);
          iVar4 = Cba_NtkGetMap2(p,iVar5);
          if ((iVar4 != 0) && (iVar3 = Prs_CreateBlifFindFon(p,iVar3), iVar3 != 0)) {
            iVar5 = Cba_NtkGetMap2(p,iVar5);
            Cba_ObjSetFinFon(p,iVar1,iVar5 + -1,iVar3);
          }
        }
      }
      else {
        CVar2 = Cba_ObjType(p,iVar1);
        if (CVar2 != CBA_BOX_NODE) {
          __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_NODE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                        ,0x225,"int Prs_CreateBlifNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        for (iTerm = 0; iVar5 = Vec_IntSize(_k), iTerm + 1 < iVar5; iTerm = iTerm + 2) {
          Vec_IntEntry(_k,iTerm);
          iVar5 = Vec_IntEntry(_k,iTerm + 1);
          iVar3 = Cba_ObjFinNum(p,iVar1);
          if (iTerm == iVar3 * 2) break;
          iVar5 = Prs_CreateBlifFindFon(p,iVar5);
          if (iVar5 != 0) {
            Cba_ObjSetFinFon(p,iVar1,iTerm / 2,iVar5);
          }
        }
      }
    }
    iObj = iObj + 1;
  } while( true );
}

Assistant:

int Prs_CreateBlifNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox;
    int i, k, iObj, iTerm, iFon, FormId, ActId;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );
    // create objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        int FuncId = Prs_BoxNtk(pNtk, i);
        assert( Prs_BoxIONum(pNtk, i) > 0 );
        assert( Vec_IntSize(vBox) % 2 == 0 );
        if ( FuncId == -1 ) // latch
        {
            iObj = Cba_ObjAlloc( p, CBA_BOX_DFFRS, 4, 1 );
            Cba_NtkSetMap( p, Vec_IntEntry(vBox, 3), Cba_ObjFon0(p, iObj) ); // latch output
            Cba_ObjSetFunc( p, iObj, Prs_BoxName(pNtk, i)+1 ); // init + 1
        }
        else if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            iObj = Cba_ObjAlloc( p, CBA_BOX_NODE, Prs_BoxIONum(pNtk, i)-1, 1 );
            Cba_FonSetName( p, Cba_ObjFon0(p, iObj), Vec_IntEntryLast(vBox) ); // node output
            Cba_NtkSetMap( p, Vec_IntEntryLast(vBox), Cba_ObjFon0(p, iObj) );
            Cba_ObjSetFunc( p, iObj, FuncId );
        }
        else // box
        {
            Cba_Ntk_t * pBox = Cba_ManNtkFind( p->pDesign, Prs_NtkStr(pNtk, FuncId) );
            iObj = Cba_ObjAlloc( p, CBA_OBJ_BOX, Cba_NtkPiNum(pBox), Cba_NtkPoNum(pBox) );
            Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            Cba_NtkForEachPo( pBox, iTerm, k )
                Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Cba_FonSetName( p, iFon, ActId );
                    Cba_NtkSetMap( p, ActId, iFon );
                }
        }
    }
    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Cba_NtkPiNum(p) + Cba_NtkPoNum(p) + i + 1;
        if ( Prs_BoxNtk(pNtk, i) == -1 ) // latch
        {
            assert( Cba_ObjType(p, iObj) == CBA_BOX_DFFRS );
            iFon = Prs_CreateBlifFindFon( p, Vec_IntEntry(vBox, 1) ); // latch input
            if ( iFon )
                Cba_ObjSetFinFon( p, iObj, 0, iFon );
        }
        else if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            assert( Cba_ObjType(p, iObj) == CBA_BOX_NODE );
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
            {
                if ( k == 2 * Cba_ObjFinNum(p, iObj) ) // stop at node output
                    break;
                iFon = Prs_CreateBlifFindFon( p, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2, iFon ); 
            }
        }
        else // box
        {
            // mark PI objects
            Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
            assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
            assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
            Cba_NtkCleanMap2( p );
            Cba_NtkForEachPi( pBox, iTerm, k )
                Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Prs_CreateBlifFindFon( p, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Cba_NtkGetMap2(p, FormId)-1, iFon );
                }
        }
    }
    // connect outputs
    Cba_NtkForEachPo( p, iObj, i )
    {
        iFon = Prs_CreateBlifFindFon( p, Cba_ObjName(p, iObj) );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, 0, iFon );
    }
    return 0;
}